

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Own<kj::File,_std::nullptr_t> __thiscall kj::newDiskFile(kj *this,OwnFd *fd)

{
  File *extraout_RDX;
  Own<kj::File,_std::nullptr_t> OVar1;
  Own<kj::(anonymous_namespace)::DiskFile,_std::nullptr_t> local_28;
  
  heap<kj::(anonymous_namespace)::DiskFile,kj::OwnFd>((kj *)&local_28,fd);
  *(Disposer **)this = local_28.disposer;
  *(DiskFile **)(this + 8) = local_28.ptr;
  local_28.ptr = (DiskFile *)0x0;
  Own<kj::(anonymous_namespace)::DiskFile,_std::nullptr_t>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<File> newDiskFile(kj::OwnFd fd) {
  return heap<DiskFile>(kj::mv(fd));
}